

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O3

void check_object_curses(object *obj)

{
  ulong uVar1;
  
  if ((ulong)z_info->curse_max != 0) {
    uVar1 = 0;
    do {
      if (obj->curses[uVar1].power != L'\0') {
        return;
      }
      uVar1 = uVar1 + 1;
    } while (z_info->curse_max != uVar1);
  }
  mem_free(obj->curses);
  obj->curses = (curse_data *)0x0;
  return;
}

Assistant:

static void check_object_curses(struct object *obj)
{
	int i;

	/* Look for a valid curse, return if one found */
	for (i = 0; i < z_info->curse_max; i++) {
		if (obj->curses[i].power) {
			return;
		}
	}

	/* Free the curse structure */
	mem_free(obj->curses);
	obj->curses = NULL;
}